

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O2

bool FIX::BoolConvertor::convert(string *value)

{
  undefined1 in_AL;
  bool bVar1;
  undefined7 in_register_00000001;
  FieldConvertError *this;
  ulong uStack_18;
  bool result;
  
  uStack_18 = CONCAT71(in_register_00000001,in_AL) & 0xffffffffffffff;
  bVar1 = convert(value,&result);
  if (bVar1) {
    return result;
  }
  this = (FieldConvertError *)__cxa_allocate_exception(0x50);
  FieldConvertError::FieldConvertError(this,value);
  __cxa_throw(this,&FieldConvertError::typeinfo,Exception::~Exception);
}

Assistant:

static bool convert( const std::string& value )
  EXCEPT ( FieldConvertError )
  {
    bool result = false;
    if( !convert( value, result ) )
      throw FieldConvertError(value);
    else
      return result;
  }